

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfScanLineInputFile.cpp
# Opt level: O1

void __thiscall Imf_2_5::ScanLineInputFile::Data::~Data(Data *this)

{
  LineBuffer *pLVar1;
  pointer psVar2;
  pointer pIVar3;
  pointer puVar4;
  pointer ppLVar5;
  ulong uVar6;
  
  ppLVar5 = (this->lineBuffers).
            super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->lineBuffers).
      super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppLVar5) {
    uVar6 = 0;
    do {
      pLVar1 = ppLVar5[uVar6];
      if (pLVar1 != (LineBuffer *)0x0) {
        if ((long *)pLVar1->endOfLineBufferData != (long *)0x0) {
          (**(code **)(*(long *)pLVar1->endOfLineBufferData + 8))();
        }
        IlmThread_2_5::Semaphore::~Semaphore((Semaphore *)(pLVar1->exception).field_2._M_local_buf);
        if ((string *)pLVar1->compressor != &pLVar1->exception) {
          operator_delete(pLVar1->compressor,(ulong)((pLVar1->exception)._M_dataplus._M_p + 1));
        }
        operator_delete(pLVar1,0x80);
      }
      uVar6 = uVar6 + 1;
      ppLVar5 = (this->lineBuffers).
                super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar6 < (ulong)((long)(this->lineBuffers).
                                   super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppLVar5 >> 3))
    ;
  }
  psVar2 = (this->optimizationData).
           super__Vector_base<Imf_2_5::(anonymous_namespace)::sliceOptimizationData,_std::allocator<Imf_2_5::(anonymous_namespace)::sliceOptimizationData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (psVar2 != (pointer)0x0) {
    operator_delete(psVar2,(long)(this->optimizationData).
                                 super__Vector_base<Imf_2_5::(anonymous_namespace)::sliceOptimizationData,_std::allocator<Imf_2_5::(anonymous_namespace)::sliceOptimizationData>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)psVar2);
  }
  ppLVar5 = (this->lineBuffers).
            super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppLVar5 != (pointer)0x0) {
    operator_delete(ppLVar5,(long)(this->lineBuffers).
                                  super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppLVar5
                   );
  }
  pIVar3 = (this->slices).
           super__Vector_base<Imf_2_5::(anonymous_namespace)::InSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::InSliceInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pIVar3 != (pointer)0x0) {
    operator_delete(pIVar3,(long)(this->slices).
                                 super__Vector_base<Imf_2_5::(anonymous_namespace)::InSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::InSliceInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pIVar3);
  }
  puVar4 = (this->offsetInLineBuffer).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar4 != (pointer)0x0) {
    operator_delete(puVar4,(long)(this->offsetInLineBuffer).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar4);
  }
  puVar4 = (this->bytesPerLine).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar4 != (pointer)0x0) {
    operator_delete(puVar4,(long)(this->bytesPerLine).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar4);
  }
  puVar4 = (this->lineOffsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar4 != (pointer)0x0) {
    operator_delete(puVar4,(long)(this->lineOffsets).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar4);
  }
  std::
  _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
               *)&this->frameBuffer);
  Header::~Header(&this->header);
  return;
}

Assistant:

ScanLineInputFile::Data::~Data ()
{
    for (size_t i = 0; i < lineBuffers.size(); i++)
        delete lineBuffers[i];
}